

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_directives(JSParseState *s)

{
  int iVar1;
  JSParseState *in_RDI;
  bool bVar2;
  JSParseState *in_stack_00000008;
  BOOL has_semi;
  JSParsePos pos;
  char str [20];
  JSParsePos *in_stack_ffffffffffffffa8;
  JSParseState *in_stack_ffffffffffffffb0;
  JSParsePos local_40;
  char local_28 [24];
  JSParseState *local_10;
  int local_4;
  
  if ((in_RDI->token).val == -0x7f) {
    local_10 = in_RDI;
    js_parse_get_pos(in_RDI,&local_40);
    while ((local_10->token).val == -0x7f) {
      snprintf(local_28,0x14,"%.*s",
               (ulong)(((int)local_10->buf_ptr - (int)(local_10->token).ptr) - 2),
               (local_10->token).ptr + 1);
      iVar1 = next_token(in_stack_00000008);
      if (iVar1 != 0) {
        return -1;
      }
      bVar2 = false;
      in_stack_ffffffffffffffb0 = (JSParseState *)(ulong)((local_10->token).val + 0x80);
      switch(in_stack_ffffffffffffffb0) {
      case (JSParseState *)0x0:
      case (JSParseState *)0x1:
      case (JSParseState *)0x2:
      case (JSParseState *)0x3:
      case (JSParseState *)0x4:
      case (JSParseState *)0x14:
      case (JSParseState *)0x15:
      case (JSParseState *)0x2b:
      case (JSParseState *)0x2c:
      case (JSParseState *)0x2d:
      case (JSParseState *)0x2e:
      case (JSParseState *)0x30:
      case (JSParseState *)0x31:
      case (JSParseState *)0x32:
      case (JSParseState *)0x33:
      case (JSParseState *)0x35:
      case (JSParseState *)0x36:
      case (JSParseState *)0x39:
      case (JSParseState *)0x3a:
      case (JSParseState *)0x3b:
      case (JSParseState *)0x3e:
      case (JSParseState *)0x41:
      case (JSParseState *)0x42:
      case (JSParseState *)0x45:
      case (JSParseState *)0x46:
      case (JSParseState *)0x47:
      case (JSParseState *)0x48:
      case (JSParseState *)0x49:
      case (JSParseState *)0x4a:
      case (JSParseState *)0x4b:
      case (JSParseState *)0x4d:
      case (JSParseState *)0x4e:
      case (JSParseState *)0x50:
      case (JSParseState *)0x51:
      case (JSParseState *)0x52:
      case (JSParseState *)0x53:
      case (JSParseState *)0x54:
      case (JSParseState *)0x55:
      case (JSParseState *)0x56:
        bVar2 = local_10->got_lf != 0;
        break;
      default:
        break;
      case (JSParseState *)0x2a:
      case (JSParseState *)0xfd:
        bVar2 = true;
        break;
      case (JSParseState *)0xbb:
        iVar1 = next_token(in_stack_00000008);
        if (iVar1 != 0) {
          return -1;
        }
        bVar2 = true;
      }
      if (!bVar2) break;
      iVar1 = strcmp(local_28,"use strict");
      if (iVar1 == 0) {
        local_10->cur_func->has_use_strict = 1;
        local_10->cur_func->js_mode = local_10->cur_func->js_mode | 1;
      }
      else {
        iVar1 = strcmp(local_28,"use strip");
        if (iVar1 == 0) {
          local_10->cur_func->js_mode = local_10->cur_func->js_mode | 2;
        }
      }
    }
    local_4 = js_parse_seek_token(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static __exception int js_parse_directives(JSParseState *s)
{
    char str[20];
    JSParsePos pos;
    BOOL has_semi;

    if (s->token.val != TOK_STRING)
        return 0;

    js_parse_get_pos(s, &pos);

    while(s->token.val == TOK_STRING) {
        /* Copy actual source string representation */
        snprintf(str, sizeof str, "%.*s",
                 (int)(s->buf_ptr - s->token.ptr - 2), s->token.ptr + 1);

        if (next_token(s))
            return -1;

        has_semi = FALSE;
        switch (s->token.val) {
        case ';':
            if (next_token(s))
                return -1;
            has_semi = TRUE;
            break;
        case '}':
        case TOK_EOF:
            has_semi = TRUE;
            break;
        case TOK_NUMBER:
        case TOK_STRING:
        case TOK_TEMPLATE:
        case TOK_IDENT:
        case TOK_REGEXP:
        case TOK_DEC:
        case TOK_INC:
        case TOK_NULL:
        case TOK_FALSE:
        case TOK_TRUE:
        case TOK_IF:
        case TOK_RETURN:
        case TOK_VAR:
        case TOK_THIS:
        case TOK_DELETE:
        case TOK_TYPEOF:
        case TOK_NEW:
        case TOK_DO:
        case TOK_WHILE:
        case TOK_FOR:
        case TOK_SWITCH:
        case TOK_THROW:
        case TOK_TRY:
        case TOK_FUNCTION:
        case TOK_DEBUGGER:
        case TOK_WITH:
        case TOK_CLASS:
        case TOK_CONST:
        case TOK_ENUM:
        case TOK_EXPORT:
        case TOK_IMPORT:
        case TOK_SUPER:
        case TOK_INTERFACE:
        case TOK_LET:
        case TOK_PACKAGE:
        case TOK_PRIVATE:
        case TOK_PROTECTED:
        case TOK_PUBLIC:
        case TOK_STATIC:
            /* automatic insertion of ';' */
            if (s->got_lf)
                has_semi = TRUE;
            break;
        default:
            break;
        }
        if (!has_semi)
            break;
        if (!strcmp(str, "use strict")) {
            s->cur_func->has_use_strict = TRUE;
            s->cur_func->js_mode |= JS_MODE_STRICT;
        }
#if !defined(DUMP_BYTECODE) || !(DUMP_BYTECODE & 8)
        else if (!strcmp(str, "use strip")) {
            s->cur_func->js_mode |= JS_MODE_STRIP;
        }
#endif
#ifdef CONFIG_BIGNUM
        else if (s->ctx->bignum_ext && !strcmp(str, "use math")) {
            s->cur_func->js_mode |= JS_MODE_MATH;
        }
#endif
    }
    return js_parse_seek_token(s, &pos);
}